

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,PositionBatch<xsimd::batch<float,_xsimd::avx>_> *position)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  batch sin_angle;
  batch cos_angle;
  batch *pbVar26;
  PolarExtentCoreContext *ctx_00;
  undefined4 uVar27;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar37;
  undefined1 auVar30 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  
  fVar1 = *(float *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  fVar2 = *(float *)&this[9].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar37 = *(float *)((long)&this[9].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  fVar5 = *(float *)&ctx->num_points;
  fVar6 = *(float *)((long)&ctx->num_points + 4);
  fVar7 = *(float *)&ctx->num_speakers;
  fVar8 = *(float *)((long)&ctx->num_speakers + 4);
  fVar9 = *(float *)&ctx->real_num_speakers;
  fVar10 = *(float *)((long)&ctx->real_num_speakers + 4);
  fVar11 = *(float *)&ctx->xs;
  fVar12 = *(float *)&ctx->ys;
  fVar13 = *(float *)((long)&ctx->ys + 4);
  fVar14 = *(float *)&ctx->zs;
  fVar15 = *(float *)((long)&ctx->zs + 4);
  fVar16 = *(float *)&ctx->panning_results;
  fVar17 = *(float *)((long)&ctx->panning_results + 4);
  fVar18 = *(float *)&ctx->summed_panning_results;
  fVar19 = *(float *)&ctx->is_circular;
  fVar20 = ctx->flippedBasis[0];
  fVar21 = ctx->flippedBasis[1];
  fVar22 = ctx->flippedBasis[2];
  fVar23 = ctx->flippedBasis[3];
  fVar24 = ctx->flippedBasis[4];
  fVar25 = ctx->flippedBasis[5];
  fVar46 = *(float *)&this[10].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar3 = *(float *)((long)&this[10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar28._0_4_ = fVar1 * fVar5 + fVar2 * fVar12 + fVar19 * fVar37;
  auVar28._4_4_ = fVar1 * fVar6 + fVar2 * fVar13 + fVar20 * fVar37;
  auVar28._8_4_ = fVar1 * fVar7 + fVar2 * fVar14 + fVar21 * fVar37;
  auVar28._12_4_ = fVar1 * fVar8 + fVar2 * fVar15 + fVar22 * fVar37;
  auVar28._16_4_ = fVar1 * fVar9 + fVar2 * fVar16 + fVar23 * fVar37;
  auVar28._20_4_ = fVar1 * fVar10 + fVar2 * fVar17 + fVar24 * fVar37;
  auVar28._24_4_ = fVar1 * fVar11 + fVar2 * fVar18 + fVar25 * fVar37;
  auVar28._28_4_ = fVar1 + fVar2 + fVar37;
  fVar1 = *(float *)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar40 = fVar5 * fVar46 + fVar12 * fVar3 + fVar19 * fVar1;
  fVar41 = fVar6 * fVar46 + fVar13 * fVar3 + fVar20 * fVar1;
  fVar42 = fVar7 * fVar46 + fVar14 * fVar3 + fVar21 * fVar1;
  fVar43 = fVar8 * fVar46 + fVar15 * fVar3 + fVar22 * fVar1;
  fVar44 = fVar9 * fVar46 + fVar16 * fVar3 + fVar23 * fVar1;
  fVar45 = fVar10 * fVar46 + fVar17 * fVar3 + fVar24 * fVar1;
  fVar46 = fVar11 * fVar46 + fVar18 * fVar3 + fVar25 * fVar1;
  fVar1 = *(float *)((long)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  fVar2 = *(float *)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar37 = *(float *)((long)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar39._8_4_ = 0x7fffffff;
  auVar39._0_8_ = 0x7fffffff7fffffff;
  auVar39._12_4_ = 0x7fffffff;
  auVar39._16_4_ = 0x7fffffff;
  auVar39._20_4_ = 0x7fffffff;
  auVar39._24_4_ = 0x7fffffff;
  auVar39._28_4_ = 0x7fffffff;
  auVar38._0_4_ = fVar5 * fVar1 + fVar12 * fVar2 + fVar19 * fVar37;
  auVar38._4_4_ = fVar6 * fVar1 + fVar13 * fVar2 + fVar20 * fVar37;
  auVar38._8_4_ = fVar7 * fVar1 + fVar14 * fVar2 + fVar21 * fVar37;
  auVar38._12_4_ = fVar8 * fVar1 + fVar15 * fVar2 + fVar22 * fVar37;
  auVar38._16_4_ = fVar9 * fVar1 + fVar16 * fVar2 + fVar23 * fVar37;
  auVar38._20_4_ = fVar10 * fVar1 + fVar17 * fVar2 + fVar24 * fVar37;
  auVar38._24_4_ = fVar11 * fVar1 + fVar18 * fVar2 + fVar25 * fVar37;
  auVar38._28_4_ = fVar1 + fVar2 + ctx->flippedBasis[6];
  auVar28 = vandps_avx(auVar28,auVar39);
  fVar1 = *(float *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar2 = *(float *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar29._0_4_ = auVar28._0_4_ * fVar1 + fVar40 * fVar2;
  auVar29._4_4_ = auVar28._4_4_ * fVar1 + fVar41 * fVar2;
  auVar29._8_4_ = auVar28._8_4_ * fVar1 + fVar42 * fVar2;
  auVar29._12_4_ = auVar28._12_4_ * fVar1 + fVar43 * fVar2;
  auVar29._16_4_ = auVar28._16_4_ * fVar1 + fVar44 * fVar2;
  auVar29._20_4_ = auVar28._20_4_ * fVar1 + fVar45 * fVar2;
  auVar29._24_4_ = auVar28._24_4_ * fVar1 + fVar46 * fVar2;
  auVar29._28_4_ = fVar1 + fVar2;
  auVar29 = vcmpps_avx(ZEXT832(0) << 0x20,auVar29,2);
  auVar4 = vandps_avx(auVar38,auVar39);
  uVar27 = auVar4._28_4_;
  uVar31 = 0;
  uVar32 = 0;
  uVar33 = 0;
  uVar34 = 0;
  uVar35 = 0;
  uVar36 = 0;
  fVar37 = 0.0;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[1] = (float)in_stack_ffffffffffffff6c;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[0] = (float)in_stack_ffffffffffffff68;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[2] = (float)in_stack_ffffffffffffff70;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[3] = (float)in_stack_ffffffffffffff74;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[4] = (float)in_stack_ffffffffffffff78;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[5] = (float)in_stack_ffffffffffffff7c;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[6] = (float)in_stack_ffffffffffffff80;
  sin_angle.super_simd_register<float,_xsimd::avx>.data[7] = in_stack_ffffffffffffff84;
  weight_from_sin(__return_storage_ptr__,this,ctx,sin_angle);
  fVar1 = *(float *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar2 = *(float *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar30._0_4_ = fVar1 * auVar28._0_4_ + fVar2 * fVar40;
  auVar30._4_4_ = fVar1 * auVar28._4_4_ + fVar2 * fVar41;
  auVar30._8_4_ = fVar1 * auVar28._8_4_ + fVar2 * fVar42;
  auVar30._12_4_ = fVar1 * auVar28._12_4_ + fVar2 * fVar43;
  auVar30._16_4_ = fVar1 * auVar28._16_4_ + fVar2 * fVar44;
  auVar30._20_4_ = fVar1 * auVar28._20_4_ + fVar2 * fVar45;
  auVar30._24_4_ = fVar1 * auVar28._24_4_ + fVar2 * fVar46;
  auVar30._28_4_ = fVar1 + fVar37;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[1] = (float)uVar31;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[0] = (float)uVar27;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[2] = (float)uVar32;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[3] = (float)uVar33;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[4] = (float)uVar34;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[5] = (float)uVar35;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[6] = (float)uVar36;
  cos_angle.super_simd_register<float,_xsimd::avx>.data[7] = fVar37;
  pbVar26 = weight_from_cos(__return_storage_ptr__,this,ctx_00,cos_angle);
  auVar4._4_4_ = uVar31;
  auVar4._0_4_ = uVar27;
  auVar4._8_4_ = uVar32;
  auVar4._12_4_ = uVar33;
  auVar4._16_4_ = uVar34;
  auVar4._20_4_ = uVar35;
  auVar4._24_4_ = uVar36;
  auVar4._28_4_ = fVar37;
  auVar28 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),ZEXT1632(ZEXT816(0) << 0x40),0xf);
  auVar28 = auVar28 & ~auVar29;
  if (((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
            (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          SUB321(auVar28 >> 0x7f,0) != '\0') ||
         (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        SUB321(auVar28 >> 0xbf,0) != '\0') ||
       (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
     && ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
              (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            SUB321(auVar29 >> 0x7f,0) != '\0') ||
           (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          SUB321(auVar29 >> 0xbf,0) != '\0') ||
         (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0'
        )) {
    vblendvps_avx(auVar30,auVar4,auVar29);
  }
  return pbVar26;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }